

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::BasicResourceAtomicCounter::RunIteration
          (BasicResourceAtomicCounter *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  bool bVar1;
  GLuint GVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined4 *puVar9;
  uint *puVar10;
  ulong uVar11;
  reference pvVar12;
  uint local_a0 [2];
  GLuint value;
  allocator<unsigned_int> local_91;
  GLuint i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> data;
  GLuint kSize;
  GLint kDepth;
  GLint kHeight;
  GLint kWidth;
  GLint p [2];
  string local_50;
  byte local_29;
  uvec3 *puStack_28;
  bool dispatch_indirect_local;
  uvec3 *num_groups_local;
  uvec3 *local_size_local;
  BasicResourceAtomicCounter *this_local;
  
  local_29 = dispatch_indirect;
  puStack_28 = num_groups;
  num_groups_local = param_1;
  local_size_local = (uvec3 *)this;
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  gl4cts::(anonymous_namespace)::BasicResourceAtomicCounter::GenSource_abi_cxx11_
            (&local_50,this,num_groups_local,puStack_28);
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_50);
  this->m_program = GVar2;
  std::__cxx11::string::~string((string *)&local_50);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,(bool *)0x0);
  if (bVar1) {
    memset(&kHeight,0,8);
    glu::CallLogWrapper::glGetActiveAtomicCounterBufferiv
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program,0,0x90ed,&kHeight);
    glu::CallLogWrapper::glGetActiveAtomicCounterBufferiv
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program,1,0x90ed,&kWidth);
    if ((kHeight == 0) || (kWidth == 0)) {
      anon_unknown_0::Output("ATOMIC_COUNTER_BUFFER_REFERENCED_BY_COMPUTE_SHADER should be TRUE.\n")
      ;
      this_local._7_1_ = 0;
    }
    else {
      uVar3 = tcu::Vector<unsigned_int,_3>::x(num_groups_local);
      uVar4 = tcu::Vector<unsigned_int,_3>::x(puStack_28);
      uVar5 = tcu::Vector<unsigned_int,_3>::y(num_groups_local);
      uVar6 = tcu::Vector<unsigned_int,_3>::y(puStack_28);
      uVar7 = tcu::Vector<unsigned_int,_3>::z(num_groups_local);
      uVar8 = tcu::Vector<unsigned_int,_3>::z(puStack_28);
      data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           uVar3 * uVar4 * uVar5 * uVar6 * uVar7 * uVar8;
      if (this->m_storage_buffer == 0) {
        glu::CallLogWrapper::glGenBuffers
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_storage_buffer);
      }
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,this->m_storage_buffer);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,
                 (ulong)data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage._4_4_ << 3,(void *)0x0,0x88e8);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0);
      if (this->m_counter_buffer[0] == 0) {
        glu::CallLogWrapper::glGenBuffers
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,2,this->m_counter_buffer);
      }
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,0,this->m_counter_buffer[0]);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,4,(void *)0x0,0x88e0);
      puVar9 = (undefined4 *)
               glu::CallLogWrapper::glMapBuffer
                         (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                           super_CallLogWrapper,0x92c0,0x88b9);
      *puVar9 = 0;
      glu::CallLogWrapper::glUnmapBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,1,this->m_counter_buffer[1]);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,4,(void *)0x0,0x88e0);
      uVar3 = data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_;
      puVar10 = (uint *)glu::CallLogWrapper::glMapBuffer
                                  (&(this->super_ComputeShaderBase).super_SubcaseBase.
                                    super_GLWrapper.super_CallLogWrapper,0x92c0,0x88b9);
      *puVar10 = uVar3;
      glu::CallLogWrapper::glUnmapBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,0);
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program);
      if ((local_29 & 1) == 0) {
        uVar3 = tcu::Vector<unsigned_int,_3>::x(puStack_28);
        uVar4 = tcu::Vector<unsigned_int,_3>::y(puStack_28);
        uVar5 = tcu::Vector<unsigned_int,_3>::z(puStack_28);
        glu::CallLogWrapper::glDispatchCompute
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,uVar3,uVar4,uVar5);
      }
      else {
        if (this->m_dispatch_buffer == 0) {
          glu::CallLogWrapper::glGenBuffers
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,1,&this->m_dispatch_buffer);
        }
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90ee,this->m_dispatch_buffer);
        puVar10 = tcu::Vector<unsigned_int,_3>::operator[](puStack_28,0);
        glu::CallLogWrapper::glBufferData
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90ee,0xc,puVar10,0x88e4);
        glu::CallLogWrapper::glDispatchComputeIndirect
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0);
      }
      uVar11 = (ulong)data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_;
      std::allocator<unsigned_int>::allocator(&local_91);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,uVar11,&local_91);
      std::allocator<unsigned_int>::~allocator(&local_91);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,this->m_storage_buffer);
      glu::CallLogWrapper::glMemoryBarrier
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x200);
      uVar11 = (ulong)data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_;
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,0);
      glu::CallLogWrapper::glGetBufferSubData
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,uVar11 << 2,pvVar12);
      for (value = 0;
          value < data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_; value = value + 1) {
        pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,(ulong)value)
        ;
        GVar2 = value;
        if (*pvVar12 != value) {
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,
                               (ulong)value);
          anon_unknown_0::Output
                    ("Value at index %d is %d should be %d.\n",(ulong)GVar2,(ulong)*pvVar12,
                     (ulong)value);
          this_local._7_1_ = 0;
          goto LAB_00f6d207;
        }
      }
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,this->m_counter_buffer[0]);
      glu::CallLogWrapper::glGetBufferSubData
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,0,4,local_a0);
      if (local_a0[0] ==
          data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_) {
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x92c0,this->m_counter_buffer[1]);
        glu::CallLogWrapper::glGetBufferSubData
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x92c0,0,4,local_a0);
        if (local_a0[0] == 0) {
          this_local._7_1_ = 1;
        }
        else {
          anon_unknown_0::Output
                    ("Final atomic counter value (buffer 1) is %d should be %d.\n",
                     (ulong)local_a0[0],0);
          this_local._7_1_ = 0;
        }
      }
      else {
        anon_unknown_0::Output
                  ("Final atomic counter value (buffer 0) is %d should be %d.\n",(ulong)local_a0[0],
                   (ulong)data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        this_local._7_1_ = 0;
      }
LAB_00f6d207:
      local_a0[1] = 1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		GLint p[2] = { 0 };
		glGetActiveAtomicCounterBufferiv(m_program, 0, GL_ATOMIC_COUNTER_BUFFER_REFERENCED_BY_COMPUTE_SHADER, &p[0]);
		glGetActiveAtomicCounterBufferiv(m_program, 1, GL_ATOMIC_COUNTER_BUFFER_REFERENCED_BY_COMPUTE_SHADER, &p[1]);

		if (p[0] == GL_FALSE || p[1] == GL_FALSE)
		{
			Output("ATOMIC_COUNTER_BUFFER_REFERENCED_BY_COMPUTE_SHADER should be TRUE.\n");
			return false;
		}

		const GLint  kWidth  = static_cast<GLint>(local_size.x() * num_groups.x());
		const GLint  kHeight = static_cast<GLint>(local_size.y() * num_groups.y());
		const GLint  kDepth  = static_cast<GLint>(local_size.z() * num_groups.z());
		const GLuint kSize   = kWidth * kHeight * kDepth;

		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(GLuint) * kSize * 2, NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		if (m_counter_buffer[0] == 0)
			glGenBuffers(2, m_counter_buffer);

		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, m_counter_buffer[0]);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, sizeof(GLuint), NULL, GL_STREAM_DRAW);
		*static_cast<GLuint*>(glMapBuffer(GL_ATOMIC_COUNTER_BUFFER, GL_WRITE_ONLY)) = 0;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);

		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 1, m_counter_buffer[1]);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, sizeof(GLuint), NULL, GL_STREAM_DRAW);
		*static_cast<GLuint*>(glMapBuffer(GL_ATOMIC_COUNTER_BUFFER, GL_WRITE_ONLY)) = kSize;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}

		std::vector<GLuint> data(kSize);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLuint) * kSize, &data[0]);

		for (GLuint i = 0; i < kSize; ++i)
		{
			if (data[i] != i)
			{
				Output("Value at index %d is %d should be %d.\n", i, data[i], i);
				return false;
			}
		}

		GLuint value;
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, m_counter_buffer[0]);
		glGetBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, sizeof(GLuint), &value);
		if (value != kSize)
		{
			Output("Final atomic counter value (buffer 0) is %d should be %d.\n", value, kSize);
			return false;
		}

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, m_counter_buffer[1]);
		glGetBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, sizeof(GLuint), &value);
		if (value != 0)
		{
			Output("Final atomic counter value (buffer 1) is %d should be %d.\n", value, 0);
			return false;
		}

		return true;
	}